

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.h
# Opt level: O3

void __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::resetBasePointer
          (TypedDeepImageChannel<unsigned_int> *this)

{
  ImageLevel *pIVar1;
  
  pIVar1 = (this->super_DeepImageChannel).super_ImageChannel._level;
  this->_base = this->_sampleListPointers +
                (-((long)(this->super_DeepImageChannel).super_ImageChannel._pixelsPerRow *
                  (long)(pIVar1->_dataWindow).min.y) - (long)(pIVar1->_dataWindow).min.x);
  return;
}

Assistant:

ImageLevel &        level ()                    {return _level;}